

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86::forward_fp16s
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint _elempack;
  void *local_a0;
  int *local_98;
  size_t local_90;
  int local_88;
  Allocator *local_80;
  int local_78;
  int local_74;
  undefined8 local_70;
  int local_68;
  size_t local_60;
  Option opt_flatten;
  
  local_78 = bottom_blob->dims;
  if (local_78 == 2) {
    iVar2 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86[-3]) /
            *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]);
    local_74 = bottom_blob->w;
    if (bottom_blob->w == iVar2) {
      local_74 = iVar2;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]),
                    bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        return 0;
      }
    }
  }
  else {
    local_74 = bottom_blob->w;
  }
  local_a0 = bottom_blob->data;
  local_98 = bottom_blob->refcount;
  local_90 = bottom_blob->elemsize;
  local_88 = bottom_blob->elempack;
  local_80 = bottom_blob->allocator;
  local_70._0_4_ = bottom_blob->h;
  local_70._4_4_ = bottom_blob->d;
  local_68 = bottom_blob->c;
  local_60 = bottom_blob->cstep;
  iVar2 = local_78;
  if (local_98 != (int *)0x0) {
    LOCK();
    *local_98 = *local_98 + 1;
    UNLOCK();
    iVar2 = bottom_blob->dims;
  }
  if (iVar2 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
    opt_flatten.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_reserved_6 = opt->use_reserved_6;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_a0);
  }
  uVar1 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]);
  if (opt->use_packing_layout == true) {
    _elempack = 8;
    if ((uVar1 & 7) != 0) {
      _elempack = (uint)((uVar1 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  Mat::create(top_blob,(int)uVar1 / (int)_elempack,
              (ulong)_elempack * (local_90 / (ulong)(long)local_88),_elempack,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    iVar2 = -100;
  }
  else {
    iVar2 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar2 = 0;
    }
  }
  if (local_98 != (int *)0x0) {
    LOCK();
    *local_98 = *local_98 + -1;
    UNLOCK();
    if (*local_98 == 0) {
      if (local_80 == (Allocator *)0x0) {
        free(local_a0);
      }
      else {
        (*local_80->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int InnerProduct_x86::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}